

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

uint Io_NtkWriteNodes(FILE *pFile,Abc_Ntk_t *pNtk)

{
  FILE *pFile_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  ProgressBar *p;
  int local_40;
  uint local_3c;
  int i;
  uint coreCellArea;
  uint numNodes;
  uint numTerms;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pLatch;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  local_3c = 0;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0xbf,"unsigned int Io_NtkWriteNodes(FILE *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkPiNum(pNtk);
  iVar2 = Abc_NtkPoNum(pNtk);
  uVar3 = iVar1 + iVar2;
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar2 = Abc_NtkLatchNum(pNtk);
  uVar4 = uVar3 + iVar1 + iVar2;
  printf("NumNodes : %d\t",(ulong)uVar4);
  printf("NumTerminals : %d\n",(ulong)uVar3);
  fprintf((FILE *)pFile,"UCLA    nodes    1.0\n");
  fprintf((FILE *)pFile,"NumNodes : %d\n",(ulong)uVar4);
  fprintf((FILE *)pFile,"NumTerminals : %d\n",(ulong)uVar3);
  Io_NtkWritePiPoNodes(pFile,pNtk);
  iVar1 = Abc_NtkIsComb(pNtk);
  if (iVar1 == 0) {
    for (local_40 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_40 < iVar1; local_40 = local_40 + 1)
    {
      pAVar5 = Abc_NtkBox(pNtk,local_40);
      iVar1 = Abc_ObjIsLatch(pAVar5);
      if (iVar1 != 0) {
        Io_NtkWriteLatchNode(pFile,pAVar5,0);
        local_3c = local_3c + 6;
      }
    }
  }
  pFile_00 = _stdout;
  iVar1 = Abc_NtkNodeNum(pNtk);
  p = Extra_ProgressBarStart(pFile_00,iVar1);
  for (local_40 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_40 < iVar1; local_40 = local_40 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_40);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) {
      Extra_ProgressBarUpdate(p,local_40,(char *)0x0);
      uVar3 = Io_NtkWriteIntNode(pFile,pAVar5,0);
      local_3c = uVar3 + local_3c;
    }
  }
  Extra_ProgressBarStop(p);
  return local_3c;
}

Assistant:

unsigned Io_NtkWriteNodes( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pLatch, * pNode;
    unsigned numTerms, numNodes, coreCellArea=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the forehead
    numTerms=Abc_NtkPiNum(pNtk)+Abc_NtkPoNum(pNtk);
    numNodes=numTerms+Abc_NtkNodeNum(pNtk)+Abc_NtkLatchNum(pNtk);
    printf("NumNodes : %d\t", numNodes );
    printf("NumTerminals : %d\n", numTerms );
    fprintf( pFile, "UCLA    nodes    1.0\n");
    fprintf( pFile, "NumNodes : %d\n", numNodes );
    fprintf( pFile, "NumTerminals : %d\n", numTerms );
    // write the PI/POs
    Io_NtkWritePiPoNodes( pFile, pNtk );
    // write the latches
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            Io_NtkWriteLatchNode( pFile, pLatch, NODES );
            coreCellArea+=6*coreHeight;
        }
    }
    // write each internal node
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        coreCellArea+=Io_NtkWriteIntNode( pFile, pNode, NODES );
    }
    Extra_ProgressBarStop( pProgress );
    return coreCellArea;
}